

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t
exr_get_chunk_table(exr_const_context_t_conflict ctxt,int part_index,uint64_t **table,int32_t *count
                   )

{
  exr_result_t eVar1;
  exr_context_t nonc;
  uint64_t chunkmin;
  
  if (table != (uint64_t **)0x0) {
    eVar1 = exr_get_chunk_count(ctxt,part_index,count);
    if (eVar1 == 0) {
      if (ctxt == (exr_const_context_t_conflict)0x0) {
        eVar1 = 2;
      }
      else {
        if (ctxt->mode == '\x01') {
          pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
        }
        if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
          if (ctxt->mode == '\x01') {
            pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
          }
          eVar1 = (*ctxt->print_error)
                            (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index);
        }
        else {
          eVar1 = extract_chunk_table(ctxt,ctxt->parts[(uint)part_index],table,&chunkmin);
        }
      }
    }
    return eVar1;
  }
  return 3;
}

Assistant:

exr_result_t
exr_get_chunk_table (exr_const_context_t ctxt, int part_index, uint64_t **table, int32_t* count)
{
    exr_result_t rv;

    if (!table)
        return EXR_ERR_INVALID_ARGUMENT;

    rv = exr_get_chunk_count (ctxt, part_index, count);
    if (rv == EXR_ERR_SUCCESS)
    {
        uint64_t chunkmin;
        EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

        /* need to read from the file to get the packed chunk size */
        rv = extract_chunk_table (ctxt, part, table, &chunkmin);

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    return rv;
}